

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::SkipWhitespace(AsciiParser *this)

{
  int *piVar1;
  StreamReader *pSVar2;
  int iVar3;
  ulong uVar4;
  byte in_R8B;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  
  pSVar2 = this->_sr;
  uVar4 = pSVar2->length_;
  iVar3 = (this->_curr_cursor).col;
  uVar5 = pSVar2->idx_;
  do {
    if ((uVar4 <= uVar5) || (pSVar2->binary_[uVar5] == '\0')) goto LAB_0037351e;
    uVar6 = uVar5;
    if (uVar5 < uVar4) {
      uVar6 = uVar5 + 1;
      in_R8B = pSVar2->binary_[uVar5];
      pSVar2->idx_ = uVar6;
    }
    iVar7 = 1;
    if (uVar5 < uVar4) {
      iVar3 = iVar3 + 1;
      (this->_curr_cursor).col = iVar3;
      iVar7 = 3;
      if ((in_R8B < 0x21) && ((0x100001200U >> ((ulong)in_R8B & 0x3f) & 1) != 0)) {
        iVar7 = 0;
      }
    }
    uVar5 = uVar6;
  } while (iVar7 == 0);
  if (iVar7 != 1) {
LAB_0037351e:
    if ((0 < (long)pSVar2->idx_) && (uVar4 = pSVar2->idx_ - 1, uVar4 <= pSVar2->length_)) {
      pSVar2->idx_ = uVar4;
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + -1;
      return true;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SkipWhitespace() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }
    _curr_cursor.col++;

    if ((c == ' ') || (c == '\t') || (c == '\f')) {
      // continue
    } else {
      break;
    }
  }

  // unwind 1 char
  if (!_sr->seek_from_current(-1)) {
    return false;
  }
  _curr_cursor.col--;

  return true;
}